

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::detail::Dispatch_Engine::call_function
          (Dispatch_Engine *this,string_view t_name,atomic_uint_fast32_t *t_loc,
          Function_Params *params,Type_Conversions_State *t_conversions)

{
  string_view t_name_00;
  type_conflict9 *ptVar1;
  __shared_ptr_access<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *funcs;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar2;
  Type_Conversions_State *in_stack_00000008;
  type *func;
  type *func_loc;
  pair<unsigned_long,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  local_58;
  __int_type local_40;
  uint_fast32_t loc;
  Function_Params *params_local;
  atomic_uint_fast32_t *t_loc_local;
  Dispatch_Engine *this_local;
  string_view t_name_local;
  
  this_local = (Dispatch_Engine *)t_name._M_str;
  loc = (uint_fast32_t)t_conversions;
  params_local = params;
  t_loc_local = (atomic_uint_fast32_t *)t_name._M_len;
  t_name_local._M_len = (size_t)t_loc;
  t_name_local._M_str = (char *)this;
  local_40 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)params);
  t_name_00._M_str = (char *)t_name_local._M_len;
  t_name_00._M_len = (size_t)this_local;
  get_function(&local_58,(Dispatch_Engine *)t_name._M_len,t_name_00,local_40);
  ptVar1 = std::
           get<0ul,unsigned_long,std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>>
                     (&local_58);
  this_00 = (__shared_ptr_access<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)std::
               get<1ul,unsigned_long,std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>>
                         (&local_58);
  if (*ptVar1 != local_40) {
    std::__atomic_base<unsigned_long>::operator=
              ((__atomic_base<unsigned_long> *)params_local,*ptVar1);
  }
  funcs = std::
          __shared_ptr_access<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator*(this_00);
  dispatch::
  dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
            ((dispatch *)this,funcs,(Function_Params *)loc,in_stack_00000008);
  std::
  pair<unsigned_long,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  ::~pair(&local_58);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value call_function(std::string_view t_name,
                                std::atomic_uint_fast32_t &t_loc,
                                const Function_Params &params,
                                const Type_Conversions_State &t_conversions) const {
        uint_fast32_t loc = t_loc;
        const auto [func_loc, func] = get_function(t_name, loc);
        if (func_loc != loc) {
          t_loc = uint_fast32_t(func_loc);
        }
        return dispatch::dispatch(*func, params, t_conversions);
      }